

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::MultiDrawIndexed
          (DeviceContextVkImpl *this,MultiDrawIndexedAttribs *Attribs)

{
  Uint32 UVar1;
  Uint32 UVar2;
  VkMultiDrawIndexedInfoEXT *pIndexInfo;
  MultiDrawIndexedItem *pMVar3;
  VkMultiDrawIndexedInfoEXT *pVVar4;
  MultiDrawIndexedItem *Item_1;
  Uint32 i_1;
  MultiDrawIndexedItem *Item;
  Uint32 i;
  Uint32 DrawCount;
  VkMultiDrawIndexedInfoEXT *pDrawInfo;
  MultiDrawIndexedAttribs *Attribs_local;
  DeviceContextVkImpl *this_local;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::MultiDrawIndexed
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  PrepareForIndexedDraw(this,Attribs->Flags,Attribs->IndexType);
  if (Attribs->NumInstances != 0) {
    if (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NativeMultiDrawSupported & 1U) == 0
       ) {
      for (Item_1._0_4_ = 0; (uint)Item_1 < Attribs->DrawCount; Item_1._0_4_ = (uint)Item_1 + 1) {
        pMVar3 = Attribs->pDrawItems + (uint)Item_1;
        if (pMVar3->NumIndices != 0) {
          VulkanUtilities::VulkanCommandBuffer::DrawIndexed
                    (&this->m_CommandBuffer,pMVar3->NumIndices,Attribs->NumInstances,
                     pMVar3->FirstIndexLocation,pMVar3->BaseVertex,Attribs->FirstInstanceLocation);
          (this->m_State).NumCommands = (this->m_State).NumCommands + 1;
        }
      }
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_ScratchSpace,
                 (ulong)Attribs->DrawCount * 0xc);
      pIndexInfo = (VkMultiDrawIndexedInfoEXT *)
                   std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_ScratchSpace)
      ;
      Item._4_4_ = 0;
      for (Item._0_4_ = 0; (uint)Item < Attribs->DrawCount; Item._0_4_ = (uint)Item + 1) {
        pMVar3 = Attribs->pDrawItems + (uint)Item;
        if (pMVar3->NumIndices != 0) {
          UVar1 = pMVar3->NumIndices;
          UVar2 = pMVar3->BaseVertex;
          pVVar4 = pIndexInfo + (uint)Item;
          pVVar4->firstIndex = pMVar3->FirstIndexLocation;
          pVVar4->indexCount = UVar1;
          pVVar4->vertexOffset = UVar2;
          Item._4_4_ = Item._4_4_ + 1;
        }
      }
      if (Item._4_4_ != 0) {
        VulkanUtilities::VulkanCommandBuffer::MultiDrawIndexed
                  (&this->m_CommandBuffer,Item._4_4_,pIndexInfo,Attribs->NumInstances,
                   Attribs->FirstInstanceLocation);
      }
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::MultiDrawIndexed(const MultiDrawIndexedAttribs& Attribs)
{
    TDeviceContextBase::MultiDrawIndexed(Attribs, 0);

    PrepareForIndexedDraw(Attribs.Flags, Attribs.IndexType);

    if (Attribs.NumInstances == 0)
        return;

    if (m_NativeMultiDrawSupported)
    {
        m_ScratchSpace.resize(sizeof(VkMultiDrawIndexedInfoEXT) * Attribs.DrawCount);
        VkMultiDrawIndexedInfoEXT* pDrawInfo = reinterpret_cast<VkMultiDrawIndexedInfoEXT*>(m_ScratchSpace.data());

        Uint32 DrawCount = 0;
        for (Uint32 i = 0; i < Attribs.DrawCount; ++i)
        {
            const MultiDrawIndexedItem& Item = Attribs.pDrawItems[i];
            if (Item.NumIndices > 0)
            {
                pDrawInfo[i] = {Item.FirstIndexLocation, Item.NumIndices, static_cast<int32_t>(Item.BaseVertex)};
                ++DrawCount;
            }
        }
        if (DrawCount > 0)
        {
            m_CommandBuffer.MultiDrawIndexed(DrawCount, pDrawInfo, Attribs.NumInstances, Attribs.FirstInstanceLocation);
        }
    }
    else
    {
        for (Uint32 i = 0; i < Attribs.DrawCount; ++i)
        {
            const MultiDrawIndexedItem& Item = Attribs.pDrawItems[i];
            if (Item.NumIndices > 0)
            {
                m_CommandBuffer.DrawIndexed(Item.NumIndices, Attribs.NumInstances, Item.FirstIndexLocation, Item.BaseVertex, Attribs.FirstInstanceLocation);
                ++m_State.NumCommands;
            }
        }
    }
}